

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O2

void Gia_ManPrintTents(Gia_Man_t *p)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Gia_Man_t *p_00;
  Gia_Obj_t *pGVar6;
  int i;
  Gia_Man_t *pGVar7;
  ulong uVar8;
  int iVar9;
  uint local_3c;
  
  if (p->vCos->nSize <= p->nRegs) {
    __assert_fail("Gia_ManPoNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMan.c"
                  ,0x119,"void Gia_ManPrintTents(Gia_Man_t *)");
  }
  p_00 = (Gia_Man_t *)Vec_IntAlloc(100);
  Gia_ManIncrementTravId(p);
  Gia_ObjSetTravIdCurrent(p,p->pObjs);
  pGVar7 = p_00;
  Vec_IntPush((Vec_Int_t *)p_00,0);
  i = *(int *)((long)&p_00->pName + 4);
  for (iVar9 = 0; iVar9 < p->vCos->nSize - p->nRegs; iVar9 = iVar9 + 1) {
    pGVar7 = p;
    pGVar6 = Gia_ManCo(p,iVar9);
    if (pGVar6 == (Gia_Obj_t *)0x0) break;
    pGVar7 = p;
    Gia_ManPrintTents_rec(p,pGVar6,(Vec_Int_t *)p_00);
  }
  Abc_Print((int)pGVar7,"Tents:  ");
  local_3c = 1;
  do {
    iVar9 = *(int *)((long)&p_00->pName + 4);
    uVar1 = iVar9 - i;
    if (uVar1 == 0 || iVar9 < i) {
      Abc_Print((int)pGVar7," Unused=%d\n",(ulong)(uint)(p->nObjs - iVar9));
      Vec_IntFree((Vec_Int_t *)p_00);
      return;
    }
    uVar8 = 0;
    for (; i < iVar9; i = i + 1) {
      iVar2 = Vec_IntEntry((Vec_Int_t *)p_00,i);
      pGVar6 = Gia_ManObj(p,iVar2);
      iVar3 = Gia_ObjIsPi(p,pGVar6);
      pGVar6 = Gia_ManObj(p,iVar2);
      pGVar7 = p;
      iVar4 = Gia_ObjIsRo(p,pGVar6);
      if (iVar4 != 0) {
        pGVar6 = Gia_ManObj(p,iVar2);
        iVar2 = Gia_ObjIsRo(p,pGVar6);
        if (iVar2 == 0) {
          __assert_fail("Gia_ObjIsRo(p, pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1cf,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
        }
        iVar2 = p->vCos->nSize;
        iVar4 = p->vCis->nSize;
        iVar5 = Gia_ObjCioId(pGVar6);
        pGVar6 = Gia_ManCo(p,(iVar2 - iVar4) + iVar5);
        pGVar7 = p;
        Gia_ManPrintTents_rec(p,pGVar6,(Vec_Int_t *)p_00);
      }
      uVar8 = (ulong)(uint)((int)uVar8 + iVar3);
    }
    Abc_Print((int)pGVar7,"%d=%d(%d)  ",(ulong)local_3c,(ulong)uVar1,uVar8);
    local_3c = local_3c + 1;
    i = iVar9;
  } while( true );
}

Assistant:

void Gia_ManPrintTents( Gia_Man_t * p )
{
    Vec_Int_t * vObjs;
    Gia_Obj_t * pObj;
    int t, i, iObjId, nSizePrev, nSizeCurr;
    assert( Gia_ManPoNum(p) > 0 );
    vObjs = Vec_IntAlloc( 100 );
    // save constant class
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    Vec_IntPush( vObjs, 0 );
    // create starting root
    nSizePrev = Vec_IntSize(vObjs);
    Gia_ManForEachPo( p, pObj, i )
        Gia_ManPrintTents_rec( p, pObj, vObjs );
    // build tents
    Abc_Print( 1, "Tents:  " );
    for ( t = 1; nSizePrev < Vec_IntSize(vObjs); t++ )
    {
        int nPis = 0;
        nSizeCurr = Vec_IntSize(vObjs);
        Vec_IntForEachEntryStartStop( vObjs, iObjId, i, nSizePrev, nSizeCurr )
        {
            nPis += Gia_ObjIsPi(p, Gia_ManObj(p, iObjId));
            if ( Gia_ObjIsRo(p, Gia_ManObj(p, iObjId)) )
                Gia_ManPrintTents_rec( p, Gia_ObjRoToRi(p, Gia_ManObj(p, iObjId)), vObjs );
        }
        Abc_Print( 1, "%d=%d(%d)  ", t, nSizeCurr - nSizePrev, nPis );
        nSizePrev = nSizeCurr;
    }
    Abc_Print( 1, " Unused=%d\n", Gia_ManObjNum(p) - Vec_IntSize(vObjs) );
    Vec_IntFree( vObjs );
    // the remaining objects are PIs without fanout
//    Gia_ManForEachObj( p, pObj, i )
//        if ( !Gia_ObjIsTravIdCurrent(p, pObj) )
//            Gia_ObjPrint( p, pObj );
}